

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O0

list_entry_t
duckdb::ListSliceOperations::SliceValueWithSteps
          (Vector *result,SelectionVector *sel,list_entry_t input,int64_t begin,int64_t end,
          int64_t step,idx_t *sel_idx)

{
  long lVar1;
  list_entry_t lVar2;
  unsigned_long loc;
  idx_t in_RDX;
  long in_R8;
  long in_R9;
  idx_t unaff_retaddr;
  idx_t in_stack_00000008;
  long *in_stack_00000010;
  idx_t i;
  idx_t child_idx;
  SelectionVector *this;
  undefined7 local_10;
  undefined1 in_stack_fffffffffffffff7;
  undefined1 uVar3;
  long in_stack_fffffffffffffff8;
  SelectionVector *pSVar4;
  
  if (in_R9 == in_R8) {
    local_10 = (undefined7)*in_stack_00000010;
    uVar3 = (undefined1)((ulong)*in_stack_00000010 >> 0x38);
    pSVar4 = (SelectionVector *)0x0;
  }
  else {
    loc = UnsafeNumericCast<unsigned_long,long,void>(in_R8);
    UnsafeNumericCast<unsigned_long,long,void>(in_R9);
    pSVar4 = (SelectionVector *)
             CalculateSliceLength<long>
                       (in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                        (bool)in_stack_fffffffffffffff7);
    UnsafeNumericCast<unsigned_long,long,void>(in_R8);
    if ((long)in_stack_00000008 < 0) {
      UnsafeNumericCast<unsigned_long,long,void>(in_R9);
    }
    lVar1 = *in_stack_00000010;
    for (this = (SelectionVector *)0x0; this < pSVar4;
        this = (SelectionVector *)((long)&this->sel_vector + 1)) {
      SelectionVector::set_index(this,in_RDX,loc);
      *in_stack_00000010 = *in_stack_00000010 + 1;
    }
    local_10 = (undefined7)lVar1;
    uVar3 = (undefined1)((ulong)lVar1 >> 0x38);
  }
  lVar2.offset._7_1_ = uVar3;
  lVar2.offset._0_7_ = local_10;
  lVar2.length = (uint64_t)pSVar4;
  return lVar2;
}

Assistant:

static list_entry_t SliceValueWithSteps(Vector &result, SelectionVector &sel, list_entry_t input, int64_t begin,
	                                        int64_t end, int64_t step, idx_t &sel_idx) {
		if (end - begin == 0) {
			input.length = 0;
			input.offset = sel_idx;
			return input;
		}
		input.length = CalculateSliceLength(UnsafeNumericCast<idx_t>(begin), UnsafeNumericCast<idx_t>(end), step, true);
		idx_t child_idx = input.offset + UnsafeNumericCast<idx_t>(begin);
		if (step < 0) {
			child_idx = input.offset + UnsafeNumericCast<idx_t>(end) - 1;
		}
		input.offset = sel_idx;
		for (idx_t i = 0; i < input.length; i++) {
			sel.set_index(sel_idx, child_idx);
			child_idx += static_cast<idx_t>(step); // intentional overflow??
			sel_idx++;
		}
		return input;
	}